

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_resolver.cpp
# Opt level: O0

bool __thiscall zmq::ip_addr_t::is_multicast(ip_addr_t *this)

{
  int iVar1;
  uint32_t uVar2;
  ip_addr_t *in_RDI;
  bool local_1;
  
  iVar1 = family(in_RDI);
  if (iVar1 == 2) {
    uVar2 = ntohl(*(uint32_t *)(in_RDI + 4));
    local_1 = (uVar2 & 0xf0000000) == 0xe0000000;
  }
  else {
    local_1 = in_RDI[8] == (ip_addr_t)0xff;
  }
  return local_1;
}

Assistant:

bool zmq::ip_addr_t::is_multicast () const
{
    if (family () == AF_INET) {
        //  IPv4 Multicast: address MSBs are 1110
        //  Range: 224.0.0.0 - 239.255.255.255
        return IN_MULTICAST (ntohl (ipv4.sin_addr.s_addr));
    }
    //  IPv6 Multicast: ff00::/8
    return IN6_IS_ADDR_MULTICAST (&ipv6.sin6_addr) != 0;
}